

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

char * mpack_expect_utf8_cstr_alloc(mpack_reader_t *reader,size_t maxsize)

{
  _Bool _Var1;
  size_t in_RAX;
  uint8_t *str;
  size_t length;
  size_t local_18;
  
  local_18 = in_RAX;
  str = (uint8_t *)mpack_expect_cstr_alloc_unchecked(reader,maxsize,&local_18);
  if (str != (uint8_t *)0x0) {
    _Var1 = mpack_utf8_check_impl(str,local_18,false);
    if (!_Var1) {
      free(str);
      if (reader->error == mpack_ok) {
        reader->error = mpack_error_type;
        reader->end = reader->data;
        if (reader->error_fn != (mpack_reader_error_t)0x0) {
          (*reader->error_fn)(reader,mpack_error_type);
        }
      }
      str = (uint8_t *)0x0;
    }
  }
  return (char *)str;
}

Assistant:

char* mpack_expect_utf8_cstr_alloc(mpack_reader_t* reader, size_t maxsize) {
    size_t length;
    char* str = mpack_expect_cstr_alloc_unchecked(reader, maxsize, &length);

    if (str && !mpack_utf8_check_no_null(str, length)) {
        MPACK_FREE(str);
        mpack_reader_flag_error(reader, mpack_error_type);
        return NULL;
    }

    return str;
}